

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cc
# Opt level: O0

void __thiscall phosg::Subprocess::~Subprocess(Subprocess *this)

{
  __pid_t _Var1;
  int __sig;
  Subprocess *this_local;
  
  if (-1 < this->child_pid) {
    _Var1 = wait(this,(void *)0x1);
    if (_Var1 == -1) {
      kill(this,9,__sig);
      wait(this,(void *)0x0);
    }
  }
  return;
}

Assistant:

Subprocess::~Subprocess() {
  if (this->child_pid >= 0 && this->wait(true) == -1) {
    this->kill(SIGKILL);
    this->wait();
  }
}